

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O0

void multipcm_write_rom(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  MultiPCM *ptChip;
  UINT8 *data_local;
  UINT32 length_local;
  UINT32 offset_local;
  void *info_local;
  
  if (offset <= *(uint *)((long)info + 0x22cc)) {
    data_local._0_4_ = length;
    if (*(uint *)((long)info + 0x22cc) < offset + length) {
      data_local._0_4_ = *(int *)((long)info + 0x22cc) - offset;
    }
    memcpy((void *)(*(long *)((long)info + 0x22d0) + (ulong)offset),data,(ulong)(UINT32)data_local);
  }
  return;
}

Assistant:

static void multipcm_write_rom(void *info, UINT32 offset, UINT32 length, const UINT8* data)
{
	MultiPCM *ptChip = (MultiPCM *)info;
	
	if (offset > ptChip->ROMSize)
		return;
	if (offset + length > ptChip->ROMSize)
		length = ptChip->ROMSize - offset;
	
	memcpy(ptChip->ROM + offset, data, length);
	
	return;
}